

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  int nWords_00;
  uint uVar1;
  uint local_80;
  int fChanges;
  int fNaive;
  int nWords;
  int k;
  int i;
  uint uCanonPhase;
  int pStoreIn [17];
  char *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  
  unique0x100001f6 = pCanonPerm;
  nWords_00 = Abc_TtWordNum(nVars);
  k = Abc_TtSemiCanonicize(pTruth,nVars,stack0xffffffffffffffe0,&i);
  fNaive = 0;
  while( true ) {
    if (4 < fNaive) {
      return k;
    }
    local_80 = 0;
    for (nWords = nVars + -2; -1 < nWords; nWords = nWords + -1) {
      if ((&i)[nWords] == (&i)[nWords + 1]) {
        uVar1 = Abc_TtCofactorPerm(pTruth,nWords,nWords_00,(uint)((&i)[nWords] != (&i)[nVars] / 2),
                                   stack0xffffffffffffffe0,(uint *)&k,1);
        local_80 = uVar1 | local_80;
      }
    }
    if (local_80 == 0) break;
    local_80 = 0;
    for (nWords = 1; nWords < nVars + -1; nWords = nWords + 1) {
      if ((&i)[nWords] == (&i)[nWords + 1]) {
        uVar1 = Abc_TtCofactorPerm(pTruth,nWords,nWords_00,(uint)((&i)[nWords] != (&i)[nVars] / 2),
                                   stack0xffffffffffffffe0,(uint *)&k,1);
        local_80 = uVar1 | local_80;
      }
    }
    if (local_80 == 0) {
      return k;
    }
    fNaive = fNaive + 1;
  }
  return k;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}